

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_Face(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  AActor *self;
  TArray<VMValue,_VMValue> *pTVar5;
  char *pcVar6;
  AActor *other;
  bool bVar7;
  bool bVar8;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003f627d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f6264:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f627d:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1e,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003f6077;
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    pTVar5 = defaultparam;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar3;
      uVar4 = extraout_RDX;
    }
    bVar7 = pPVar3 == (PClass *)0x0;
    ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar7);
    uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar7);
    bVar8 = pPVar3 == pPVar1;
    if (!bVar8 && !bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    pTVar5 = (TArray<VMValue,_VMValue> *)CONCAT71((int7)((ulong)pTVar5 >> 8),bVar8 || bVar7);
    if ((char)ret == '\0') {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f627d;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003f6264;
LAB_003f6077:
    self = (AActor *)0x0;
    pTVar5 = defaultparam;
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003f629c;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003f626d:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f629c:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc1f,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003f6101;
    pPVar3 = (other->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other,pTVar5,uVar4,ret);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (other->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "faceto == NULL || faceto->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f629c;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003f626d;
LAB_003f6101:
    other = (AActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f6349;
    }
    local_38.Degrees = (double)param[2].field_0.field_1.a;
LAB_003f613e:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f6368:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc21,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_40.Degrees = (double)param[3].field_0.field_1.a;
LAB_003f614f:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f6318:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc22,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_48.Degrees = (double)param[4].field_0.field_1.a;
LAB_003f6160:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f62f9:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc23,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_50.Degrees = (double)param[5].field_0.field_1.a;
LAB_003f6171:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f62da:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc24,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[6].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f6349:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0xc20,
                    "int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_38.Degrees = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003f613e;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f6368;
    }
    local_40.Degrees = (double)param[3].field_0.field_1.a;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003f614f;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f6318;
    }
    local_48.Degrees = (double)param[4].field_0.field_1.a;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003f6160;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f62f9;
    }
    local_50.Degrees = (double)param[5].field_0.field_1.a;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003f6171;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f62da;
    }
    iVar2 = param[6].field_0.i;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\x01') {
        pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_003f62bb;
      }
      goto LAB_003f618b;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\x01') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f62bb:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc25,"int AF_AActor_A_Face(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_003f618b:
  A_Face(self,other,&local_38,&local_40,&local_48,&local_50,iVar2,param[7].field_0.f);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Face)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(faceto, AActor)
	PARAM_ANGLE_DEF(max_turn)		
	PARAM_ANGLE_DEF(max_pitch)		
	PARAM_ANGLE_DEF(ang_offset)		
	PARAM_ANGLE_DEF(pitch_offset)	
	PARAM_INT_DEF(flags)			
	PARAM_FLOAT_DEF(z_add)			

	A_Face(self, faceto, max_turn, max_pitch, ang_offset, pitch_offset, flags, z_add);
	return 0;
}